

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionFileOptions_Test
::~RetentionStripTest_StripSourceRetentionFileOptions_Test
          (RetentionStripTest_StripSourceRetentionFileOptions_Test *this)

{
  RetentionStripTest_StripSourceRetentionFileOptions_Test *this_local;
  
  ~RetentionStripTest_StripSourceRetentionFileOptions_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionFileOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      option (source_retention_option) = 123;
      option (options) = {
        i1: 123
        i2: 456
        c { s: "abc" }
        rc { s: "abc" }
      };
      option (repeated_options) = {
        i1: 111 i2: 222
      };

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.FileOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  FileOptions expected_options = BuildDynamicProto<FileOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");

  FileDescriptorProto stripped_file = StripSourceRetentionOptions(*file);

  EXPECT_THAT(StripSourceRetentionOptions(*file).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*file),
              EqualsProto(expected_options));
}